

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMS_TIME_INFO_Unmarshal(TPMS_TIME_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT64_Unmarshal(&target->time,buffer,size);
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPMS_CLOCK_INFO_Unmarshal(&target->clockInfo,buffer,size);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_TIME_INFO_Unmarshal(TPMS_TIME_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT64_Unmarshal((UINT64 *)&(target->time), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMS_CLOCK_INFO_Unmarshal((TPMS_CLOCK_INFO *)&(target->clockInfo), buffer, size);
    return result;
}